

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void cleanup(EVP_PKEY_CTX *ctx)

{
  void *__ptr;
  internal_state *state;
  
  __ptr = *(void **)(ctx + 0x40);
  if (((*(uint *)(ctx + 0x3c) & 8) != 0) && (*(long *)((long)__ptr + 0x38) != 0)) {
    free(*(void **)((long)__ptr + 0x38));
  }
  if (*(long *)((long)__ptr + 0x30) != 0) {
    free(*(void **)((long)__ptr + 0x30));
  }
  free(__ptr);
  return;
}

Assistant:

static void cleanup(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (strm->flags & AEC_DATA_PREPROCESS && state->data_raw)
        free(state->data_raw);
    if (state->data_pp)
        free(state->data_pp);
    free(state);
}